

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniaudio.h
# Opt level: O1

ma_result ma_context_uninit__alsa(ma_context *pContext)

{
  ma_context *pmVar1;
  
  if (pContext == (ma_context *)0x0) {
    __assert_fail("pContext != __null",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/BombchuLink[P]ORGTerm/miniaudio.h"
                  ,0x467d,"ma_result ma_context_uninit__alsa(ma_context *)");
  }
  if (pContext->backend == ma_backend_alsa) {
    (*(pContext->field_21).alsa.snd_config_update_free_global)();
    dlclose((pContext->field_21).alsa.asoundSO);
    pmVar1 = (pContext->field_21).alsa.internalDeviceEnumLock.pContext;
    if (pmVar1 != (ma_context *)0x0) {
      (*(pmVar1->field_22).posix.pthread_mutex_destroy)
                ((undefined1 *)((long)&pContext->field_21 + 0x1c8));
    }
    return 0;
  }
  __assert_fail("pContext->backend == ma_backend_alsa",
                "/workspace/llm4binary/github/license_all_cmakelists_25/BombchuLink[P]ORGTerm/miniaudio.h"
                ,0x467e,"ma_result ma_context_uninit__alsa(ma_context *)");
}

Assistant:

static ma_result ma_context_uninit__alsa(ma_context* pContext)
{
    MA_ASSERT(pContext != NULL);
    MA_ASSERT(pContext->backend == ma_backend_alsa);

    /* Clean up memory for memory leak checkers. */
    ((ma_snd_config_update_free_global_proc)pContext->alsa.snd_config_update_free_global)();

#ifndef MA_NO_RUNTIME_LINKING
    ma_dlclose(pContext, pContext->alsa.asoundSO);
#endif

    ma_mutex_uninit(&pContext->alsa.internalDeviceEnumLock);

    return MA_SUCCESS;
}